

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_windowing.cc
# Opt level: O0

bool __thiscall
sptk::DataWindowing::Run
          (DataWindowing *this,vector<double,_std::allocator<double>_> *data,
          vector<double,_std::allocator<double>_> *windowed_data)

{
  size_type sVar1;
  const_iterator cVar2;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  const_iterator cVar4;
  iterator iVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  
  if (((((ulong)in_RDI[2] & 1) != 0) &&
      (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
      sVar1 == (long)*(int *)(in_RDI + 1))) &&
     (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 != (long)*(int *)((long)in_RDI + 0xc)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    cVar2 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    _Var3 = __gnu_cxx::
            __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                       *)in_stack_ffffffffffffff88,in_RDI);
    cVar4 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    iVar5 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::DataWindowing::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*)const::__0>
              (cVar2._M_current,_Var3._M_current,cVar4._M_current,iVar5._M_current);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              (in_stack_ffffffffffffff88,(difference_type)in_RDI);
    iVar5 = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar5._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)0x0,
               in_RDI);
    return true;
  }
  return false;
}

Assistant:

bool DataWindowing::Run(const std::vector<double>& data,
                        std::vector<double>* windowed_data) const {
  // Check inputs.
  if (!is_valid_ || data.size() != static_cast<std::size_t>(input_length_) ||
      NULL == windowed_data) {
    return false;
  }

  // Prepare memories.
  if (windowed_data->size() != static_cast<std::size_t>(output_length_)) {
    windowed_data->resize(output_length_);
  }

  // Apply window.
  std::transform(data.begin(), data.begin() + input_length_, window_.begin(),
                 windowed_data->begin(),
                 [](double x, double w) { return x * w; });

  // Fill zero.
  std::fill(windowed_data->begin() + input_length_, windowed_data->end(), 0.0);

  return true;
}